

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

string * __thiscall
glcts::anon_unknown_0::CBasicVertexIDsDef::Vsh<glcts::(anonymous_namespace)::test_api::GL>
          (string *__return_storage_ptr__,CBasicVertexIDsDef *this)

{
  bool in_DL;
  string local_38;
  CBasicVertexIDsDef *local_18;
  CBasicVertexIDsDef *this_local;
  
  local_18 = this;
  this_local = (CBasicVertexIDsDef *)__return_storage_ptr__;
  glcts::(anonymous_namespace)::test_api::GL::glslVer_abi_cxx11_(&local_38,(GL *)0x0,in_DL);
  std::operator+(__return_storage_ptr__,&local_38,
                 "\nlayout(location = 0) in vec4 i_vertex;\nlayout(location = 1) in vec4 i_vertex_instanced;\nlayout(location = 2) in float i_ref_VertexId;\nlayout(location = 3) in float i_ref_InstanceId;\nout vec4 val_Result;\nvoid main()\n{\n    gl_Position = vec4(i_vertex.xyz * .5, 1.0) + i_vertex_instanced;\n    if ( gl_VertexID == int(i_ref_VertexId + .5) && gl_InstanceID == int(i_ref_InstanceId + .5)) {\n        val_Result = vec4(0.0, 1.0, float(gl_InstanceID) / 4.0, 1.0);\n    } else {\n        val_Result = vec4(1.0, 0.0, 0.0, 1.0);\n    }\n}"
                );
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Vsh()
	{
		return api::glslVer() + NL
			   "layout(location = 0) in vec4 i_vertex;" NL "layout(location = 1) in vec4 i_vertex_instanced;" NL
			   "layout(location = 2) in float i_ref_VertexId;" NL "layout(location = 3) in float i_ref_InstanceId;" NL
			   "out vec4 val_Result;" NL "void main()" NL "{" NL
			   "    gl_Position = vec4(i_vertex.xyz * .5, 1.0) + i_vertex_instanced;" NL
			   "    if ( gl_VertexID == int(i_ref_VertexId + .5) && gl_InstanceID == int(i_ref_InstanceId + .5)) {" NL
			   "        val_Result = vec4(0.0, 1.0, float(gl_InstanceID) / 4.0, 1.0);" NL "    } else {" NL
			   "        val_Result = vec4(1.0, 0.0, 0.0, 1.0);" NL "    }" NL "}";
	}